

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool ReadMeshNgons(ON_BinaryArchive *file,ON_MeshNgonAllocator *a,
                  ON_SimpleArray<ON_MeshNgon_*> *ngons)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint ngon_count;
  uint Vcount;
  uint Fcount;
  ON_MeshNgon *ngon;
  int minor_version;
  int major_version;
  ON__UINT32 local_4c;
  ON__UINT32 local_48;
  uint local_44;
  ON_MeshNgon *local_40;
  int local_38 [2];
  
  if (-1 < ngons->m_capacity) {
    ngons->m_count = 0;
  }
  bVar2 = false;
  local_38[1] = 0;
  local_38[0] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,local_38 + 1,local_38);
  if (bVar1) {
    local_4c = 0;
    bVar1 = ON_BinaryArchive::ReadInt(file,&local_4c);
    if (bVar1) {
      if ((ulong)(long)ngons->m_capacity < (ulong)local_4c) {
        ON_SimpleArray<ON_MeshNgon_*>::SetCapacity(ngons,(ulong)local_4c);
      }
      uVar3 = 0;
      if (local_4c != 0) {
        do {
          local_48 = 0;
          bVar1 = ON_BinaryArchive::ReadInt(file,&local_48);
          if (!bVar1) break;
          if (local_48 != 0) {
            bVar1 = ON_BinaryArchive::ReadInt(file,&local_44);
            if (!bVar1) break;
            local_40 = ON_MeshNgonAllocator::AllocateNgon(a,local_48,local_44);
            bVar1 = ON_BinaryArchive::ReadInt(file,(ulong)local_48,local_40->m_vi);
            if (!bVar1) break;
            bVar1 = ON_BinaryArchive::ReadInt(file,(ulong)local_40->m_Fcount,local_40->m_fi);
            if (!bVar1) break;
            ON_SimpleArray<ON_MeshNgon_*>::Append(ngons,&local_40);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < local_4c);
      }
      bVar1 = uVar3 == local_4c;
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar2 = (bool)(bVar2 & bVar1);
  }
  return bVar2;
}

Assistant:

static
bool ReadMeshNgons( ON_BinaryArchive& file, ON_MeshNgonAllocator& a, ON_SimpleArray<ON_MeshNgon*>& ngons )
{
  ngons.SetCount(0);

  int major_version = 0;
  int minor_version = 0;
  unsigned int i, Vcount, Fcount;
  if ( !file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version) )
    return false;

  bool rc = false;
  for(;;)
  {
    unsigned int ngon_count = 0;
    if (!file.ReadInt(&ngon_count))
      break;

    ngons.Reserve(ngon_count);

    for ( i = 0; i < ngon_count; i++)
    {
      Vcount = 0;
      if ( !file.ReadInt(&Vcount) )
        break;
      if ( Vcount <= 0 )
        continue;
      if ( !file.ReadInt(&Fcount) )
        break;
      ON_MeshNgon* ngon = a.AllocateNgon(Vcount,Fcount);
      if ( !file.ReadInt(Vcount,ngon->m_vi) )
        break;
      if ( !file.ReadInt(ngon->m_Fcount,ngon->m_fi) )
        break;
      ngons.Append(ngon);
    }

    if (i == ngon_count)
      rc = true;

    break;
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}